

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objnam.c
# Opt level: O2

void add_erosion_words(obj *obj,char *prefix,boolean in_final_dump)

{
  short sVar1;
  undefined4 uVar2;
  boolean bVar3;
  ushort uVar4;
  uint uVar5;
  size_t sVar6;
  char *__s;
  uint uVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  
  sVar1 = obj->otyp;
  if ((((((*(ushort *)&objects[sVar1].field_0x11 & 0x1f0) == 0xb0) ||
        (bVar3 = is_flammable(obj), bVar3 != '\0')) || (bVar3 = is_rottable(obj), sVar1 == 0x1a)) ||
      ((bVar3 != '\0' ||
       (uVar4 = *(ushort *)&objects[obj->otyp].field_0x11 >> 4 & 0x1f, uVar4 == 0xd)))) ||
     (uVar4 == 0xb)) {
    uVar5 = *(uint *)&obj->field_0x4a;
    uVar7 = uVar5 >> 8 & 3;
    if (uVar7 != 0 && sVar1 != 0x1a) {
      if (uVar7 == 3) {
        sVar6 = strlen(prefix);
        builtin_strncpy(prefix + sVar6,"thoroughly ",0xc);
      }
      else if (uVar7 == 2) {
        sVar6 = strlen(prefix);
        builtin_strncpy(prefix + sVar6,"very ",6);
      }
      pcVar9 = "burnt ";
      if ((*(ushort *)&objects[obj->otyp].field_0x11 & 0x1f0) == 0xb0) {
        pcVar9 = "rusty ";
      }
      sVar6 = strlen(prefix);
      uVar2 = *(undefined4 *)pcVar9;
      *(undefined4 *)(prefix + sVar6 + 3) = *(undefined4 *)(pcVar9 + 3);
      *(undefined4 *)(prefix + sVar6) = uVar2;
      uVar5 = *(uint *)&obj->field_0x4a;
    }
    if ((sVar1 != 0x1a) && (uVar7 = uVar5 >> 10 & 3, uVar7 != 0)) {
      if (uVar7 == 3) {
        sVar6 = strlen(prefix);
        builtin_strncpy(prefix + sVar6,"thoroughly ",0xc);
      }
      else if (uVar7 == 2) {
        sVar6 = strlen(prefix);
        builtin_strncpy(prefix + sVar6,"very ",6);
      }
      pcVar9 = "rotted ";
      if (((*(ushort *)&objects[obj->otyp].field_0x11 >> 4 & 0x1f) - 0xb & 0xfffd) == 0) {
        pcVar9 = "corroded ";
      }
      strcat(prefix,pcVar9);
      uVar5 = *(uint *)&obj->field_0x4a;
    }
    if (((uVar5 >> 0xc & 1) != 0) && ((in_final_dump != '\0' || ((uVar5 & 0x80) != 0)))) {
      __s = eos(prefix);
      uVar5 = *(uint *)&obj->field_0x4a & 0x80;
      pcVar9 = "] [";
      pcVar10 = "";
      if (uVar5 != 0) {
        pcVar9 = "\n\n";
      }
      if (sVar1 == 0x1a) {
        pcVar8 = "fixed";
      }
      else {
        uVar4 = *(ushort *)&objects[obj->otyp].field_0x11 >> 4 & 0x1f;
        if (uVar4 == 0xb) {
          pcVar8 = "rustproof";
        }
        else if (uVar4 == 0xd) {
          pcVar8 = "corrodeproof";
        }
        else {
          bVar3 = is_flammable(obj);
          pcVar8 = "fireproof";
          if (bVar3 == '\0') {
            pcVar8 = "";
          }
          uVar5 = *(uint *)&obj->field_0x4a & 0x80;
        }
      }
      if (uVar5 == 0) {
        pcVar10 = "]";
      }
      sprintf(__s,"%s%s%s ",pcVar9 + 2,pcVar8,pcVar10);
      return;
    }
  }
  return;
}

Assistant:

static void add_erosion_words(const struct obj *obj, char *prefix,
			      boolean in_final_dump)
{
	boolean iscrys = (obj->otyp == CRYSKNIFE);


	if (!is_damageable(obj) && !iscrys) return;

	/* The only cases where any of these bits do double duty are for
	 * rotted food and diluted potions, which are all not is_damageable().
	 */
	if (obj->oeroded && !iscrys) {
		switch (obj->oeroded) {
			case 2:	strcat(prefix, "very "); break;
			case 3:	strcat(prefix, "thoroughly "); break;
		}			
		strcat(prefix, is_rustprone(obj) ? "rusty " : "burnt ");
	}
	if (obj->oeroded2 && !iscrys) {
		switch (obj->oeroded2) {
			case 2:	strcat(prefix, "very "); break;
			case 3:	strcat(prefix, "thoroughly "); break;
		}			
		strcat(prefix, is_corrodeable(obj) ? "corroded " :
			"rotted ");
	}
	if (obj->oerodeproof && (in_final_dump || obj->rknown))
		sprintf(eos(prefix), "%s%s%s ",
			obj->rknown ? "" : "[",
			iscrys ? "fixed" :
			is_rustprone(obj) ? "rustproof" :
			is_corrodeable(obj) ? "corrodeproof" :	/* "stainless"? */
			is_flammable(obj) ? "fireproof" : "",
			obj->rknown ? "" : "]");
}